

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::InitializeExistingPath
          (PathTypeHandlerBase *this,PropertyIndex slotIndex,PropertyIndex objectSlotCount,
          ScriptContext *scriptContext)

{
  TypePath *this_00;
  ThreadContext *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyRecord *pPVar4;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1f9,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00dcedf1;
    *puVar3 = 0;
  }
  this_00 = (this->typePath).ptr;
  if (((this_00->data).ptr)->maxInitializedLength <= slotIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1fc,"(slotIndex < typePath->GetMaxInitializedLength())",
                                "slotIndex < typePath->GetMaxInitializedLength()");
    if (!bVar2) goto LAB_00dcedf1;
    *puVar3 = 0;
  }
  if (((this_00->data).ptr)->maxInitializedLength < objectSlotCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1fd,"(objectSlotCount <= typePath->GetMaxInitializedLength())",
                                "objectSlotCount <= typePath->GetMaxInitializedLength()");
    if (!bVar2) goto LAB_00dcedf1;
    *puVar3 = 0;
  }
  bVar2 = TypePath::GetIsUsedFixedFieldAt(this_00,slotIndex,(uint)objectSlotCount);
  if (bVar2) {
    this_01 = scriptContext->threadContext;
    pPVar4 = TypePath::GetPropertyIdUnchecked(this_00,(uint)slotIndex);
    ThreadContext::InvalidatePropertyGuards(this_01,pPVar4->pid);
  }
  TypePath::ClearIsFixedFieldAt(this_00,slotIndex,(uint)objectSlotCount);
  bVar2 = HasOnlyInitializedNonFixedProperties(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x20d,"(HasOnlyInitializedNonFixedProperties( ))",
                                "HasOnlyInitializedNonFixedProperties( )");
    if (!bVar2) goto LAB_00dcedf1;
    *puVar3 = 0;
  }
  bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((!bVar2) &&
     ((((this->typePath).ptr)->singletonInstance).ptr !=
      (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x20e,"(HasSingletonInstanceOnlyIfNeeded( ))",
                                "HasSingletonInstanceOnlyIfNeeded( )");
    if (!bVar2) {
LAB_00dcedf1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((this_00->data).ptr)->maxInitializedLength == objectSlotCount) {
    (this_00->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::InitializeExistingPath(
        const PropertyIndex slotIndex,
        const PropertyIndex objectSlotCount,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        TypePath *const typePath = GetTypePath();
        Assert(slotIndex < typePath->GetMaxInitializedLength());
        Assert(objectSlotCount <= typePath->GetMaxInitializedLength());

        if(typePath->GetIsUsedFixedFieldAt(slotIndex, objectSlotCount))
        {
            // We are adding a new value where some other instance already has an existing value.  If this is a fixed
            // field we must clear the bit. If the value was hard coded in the JIT-ed code, we must invalidate the guards.

            // Invalidate any JIT-ed code that hard coded this method. No need to invalidate store field
            // inline caches (which might quitely overwrite this fixed fields, because they have never been populated.
            scriptContext->GetThreadContext()->InvalidatePropertyGuards(typePath->GetPropertyIdUnchecked(slotIndex)->GetPropertyId());
        }

        // If we're overwriting an existing value of this property, we don't consider the new one fixed.
        // This also means that it's ok to populate the inline caches for this property from now on.
        typePath->ClearIsFixedFieldAt(slotIndex, objectSlotCount);

        Assert(HasOnlyInitializedNonFixedProperties(/*typePath, objectSlotCount*/));
        Assert(HasSingletonInstanceOnlyIfNeeded(/*typePath*/));
        if(objectSlotCount == typePath->GetMaxInitializedLength())
        {
            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.

            // This is perhaps the most fragile point of fixed fields on path types.  If we cleared the singleton instance
            // while some fields remained fixed, the instance would be collectible, and yet some code would expect to see
            // values and call methods on it.  Clearly, a recipe for disaster.  We rely on the fact that we always add
            // properties to (pre-initialized) type handlers in the order they appear on the type path.  By the time
            // we reach the singleton instance, all fixed fields will have been invalidated.  Otherwise, some fields
            // could remain fixed (or even uninitialized) and we would have to spin off a loop here to invalidate any
            // remaining fixed fields - a rather unfortunate overhead.
            typePath->ClearSingletonInstance();
        }
    }